

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O0

_Bool test_permute_cols(void)

{
  uint n_row;
  long lVar1;
  int *colperm;
  uint8_t uVar2;
  int *piVar3;
  int aiStack_90 [4];
  undefined8 local_80;
  int aiStack_78 [4];
  int j;
  int c_1;
  int c;
  int r;
  m256v A;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_2c;
  int rc;
  int i;
  int rowscols [7];
  
  _rc = 0x200000001;
  rowscols[0] = 3;
  rowscols[1] = 5;
  rowscols[2] = 8;
  rowscols[3] = 10;
  rowscols[4] = 0xf;
  for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
    n_row = (&rc)[(int)local_2c];
    lVar1 = -((ulong)n_row * 4 + 0xf & 0xfffffffffffffff0);
    piVar3 = (int *)((long)aiStack_90 + lVar1 + 8);
    local_80 = piVar3;
    *(undefined8 *)((long)aiStack_90 + lVar1) = 0x1024b4;
    perm_rand(*(int *)((long)aiStack_78 + lVar1 + 0xc),*(int **)((long)aiStack_78 + lVar1));
    A.e = (uint8_t *)(ulong)(n_row * n_row);
    piVar3 = (int *)((long)piVar3 - (ulong)(n_row * n_row + 0xf & 0xfffffff0));
    piVar3[-2] = 0x1024e0;
    piVar3[-1] = 0;
    m256v_make((m256v *)&c,n_row,n_row,(uint8_t *)piVar3);
    for (c_1 = 0; colperm = local_80, c_1 < (int)n_row; c_1 = c_1 + 1) {
      for (j = 0; j < (int)n_row; j = j + 1) {
        piVar3[-2] = 0x10251e;
        piVar3[-1] = 0;
        m256v_set_el(*(m256v **)(piVar3 + 6),piVar3[5],piVar3[4],*(uint8_t *)((long)piVar3 + 0xf));
      }
    }
    piVar3[-2] = 0x102543;
    piVar3[-1] = 0;
    m256v_permute_cols((m256v *)&c,colperm);
    for (aiStack_78[3] = 0; aiStack_78[3] < (int)n_row; aiStack_78[3] = aiStack_78[3] + 1) {
      for (aiStack_78[2] = 0; aiStack_78[2] < (int)n_row; aiStack_78[2] = aiStack_78[2] + 1) {
        piVar3[-2] = 0x102570;
        piVar3[-1] = 0;
        uVar2 = m256v_get_el(*(m256v **)(piVar3 + 2),piVar3[1],*piVar3);
        if (uVar2 != '\0') break;
      }
      if (aiStack_78[2] != local_80[aiStack_78[3]]) {
        rowscols[5]._3_1_ = 0;
        aiStack_78[1] = 1;
        goto LAB_001025b4;
      }
    }
    aiStack_78[1] = 0;
LAB_001025b4:
    if (aiStack_78[1] != 0) goto LAB_001025da;
  }
  rowscols[5]._3_1_ = 1;
LAB_001025da:
  return (_Bool)(rowscols[5]._3_1_ & 1);
}

Assistant:

static bool test_permute_cols()
{
	const int rowscols[] = { 1, 2, 3, 5, 8, 10, 15 };
	for (int i = 0; i < array_size(rowscols); ++i) {
		const int rc = rowscols[i];

		/* Generate a random permutation */
		int p[rc];
		perm_rand(rc, p);

		/* Generate identity matrix */
		m256v_Def(A, a, rc, rc);
		for (int r = 0; r < rc; ++r) {
			for (int c = 0; c < rc; ++c) {
				m256v_set_el(&A, r, c, r==c);
			}
		}

		/* Apply perm */
		m256v_permute_cols(&A, p);

		/* Check output is as expected */
		for (int c = 0; c < rc; ++c) {
			int j;
			for (j = 0; j < rc; ++j) {
				if (m256v_get_el(&A, j, c))
					break;
			}

			if (j != p[c])
				return false;
		}
	}

	return true;
}